

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItem(ImGuiWindow *window,ImRect *nav_bb,ImGuiID id)

{
  bool bVar1;
  ImVec2 *pIVar2;
  float fVar3;
  float fVar4;
  bool local_a1;
  ImGuiNavMoveResult *local_a0;
  float VISIBLE_RATIO;
  bool new_best;
  ImGuiNavMoveResult *result;
  ImVec2 local_44;
  undefined1 local_3c [8];
  ImRect nav_bb_rel;
  ImGuiItemFlags item_flags;
  ImGuiContext *g;
  ImGuiID id_local;
  ImRect *nav_bb_local;
  ImGuiWindow *window_local;
  
  stack0xffffffffffffffd8 = GImGui;
  nav_bb_rel.Max.x = (float)(window->DC).ItemFlags;
  local_44 = ::operator-(&nav_bb->Min,&window->Pos);
  unique0x100000c1 = ::operator-(&nav_bb->Max,&window->Pos);
  ImRect::ImRect((ImRect *)local_3c,&local_44,(ImVec2 *)((long)&result + 4));
  if (((stack0xffffffffffffffd8->NavInitRequest & 1U) != 0) &&
     (stack0xffffffffffffffd8->NavLayer == (window->DC).NavLayerCurrent)) {
    if ((((uint)nav_bb_rel.Max.x & 0x10) == 0) || (stack0xffffffffffffffd8->NavInitResultId == 0)) {
      stack0xffffffffffffffd8->NavInitResultId = id;
      (stack0xffffffffffffffd8->NavInitResultRectRel).Min.x = (float)local_3c._0_4_;
      (stack0xffffffffffffffd8->NavInitResultRectRel).Min.y = (float)local_3c._4_4_;
      (stack0xffffffffffffffd8->NavInitResultRectRel).Max = nav_bb_rel.Min;
    }
    if (((uint)nav_bb_rel.Max.x & 0x10) == 0) {
      stack0xffffffffffffffd8->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
    }
  }
  if (((stack0xffffffffffffffd8->NavId != id) ||
      ((stack0xffffffffffffffd8->NavMoveRequestFlags & 0x10U) != 0)) &&
     (((uint)nav_bb_rel.Max.x & 0xc) == 0)) {
    if (window == stack0xffffffffffffffd8->NavWindow) {
      local_a0 = &stack0xffffffffffffffd8->NavMoveResultLocal;
    }
    else {
      local_a0 = &stack0xffffffffffffffd8->NavMoveResultOther;
    }
    local_a1 = false;
    if ((stack0xffffffffffffffd8->NavMoveRequest & 1U) != 0) {
      local_a1 = NavScoreItem(local_a0,*nav_bb);
    }
    if (local_a1 != false) {
      local_a0->ID = id;
      local_a0->SelectScopeId = stack0xffffffffffffffd8->MultiSelectScopeId;
      local_a0->Window = window;
      (local_a0->RectRel).Min.x = (float)local_3c._0_4_;
      (local_a0->RectRel).Min.y = (float)local_3c._4_4_;
      (local_a0->RectRel).Max = nav_bb_rel.Min;
    }
    if (((stack0xffffffffffffffd8->NavMoveRequestFlags & 0x20U) != 0) &&
       (bVar1 = ImRect::Overlaps(&window->ClipRect,nav_bb), bVar1)) {
      fVar3 = ImClamp<float>((nav_bb->Max).y,(window->ClipRect).Min.y,(window->ClipRect).Max.y);
      fVar4 = ImClamp<float>((nav_bb->Min).y,(window->ClipRect).Min.y,(window->ClipRect).Max.y);
      if ((((nav_bb->Max).y - (nav_bb->Min).y) * 0.7 <= fVar3 - fVar4) &&
         (bVar1 = NavScoreItem(&stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet,*nav_bb),
         bVar1)) {
        (stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet).ID = id;
        (stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet).SelectScopeId =
             stack0xffffffffffffffd8->MultiSelectScopeId;
        (stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet).Window = window;
        (stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet).RectRel.Min.x =
             (float)local_3c._0_4_;
        (stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet).RectRel.Min.y =
             (float)local_3c._4_4_;
        (stack0xffffffffffffffd8->NavMoveResultLocalVisibleSet).RectRel.Max = nav_bb_rel.Min;
      }
    }
  }
  if (stack0xffffffffffffffd8->NavId == id) {
    stack0xffffffffffffffd8->NavWindow = window;
    stack0xffffffffffffffd8->NavLayer = (window->DC).NavLayerCurrent;
    stack0xffffffffffffffd8->NavIdIsAlive = true;
    stack0xffffffffffffffd8->NavIdTabCounter = (window->DC).FocusCounterTab;
    pIVar2 = &window->NavRectRel[(window->DC).NavLayerCurrent].Min;
    pIVar2->x = (float)local_3c._0_4_;
    pIVar2->y = (float)local_3c._4_4_;
    pIVar2[1] = nav_bb_rel.Min;
  }
  return;
}

Assistant:

static void ImGui::NavProcessItem(ImGuiWindow* window, const ImRect& nav_bb, const ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    //if (!g.IO.NavActive)  // [2017/10/06] Removed this possibly redundant test but I am not sure of all the side-effects yet. Some of the feature here will need to work regardless of using a _NoNavInputs flag.
    //    return;

    const ImGuiItemFlags item_flags = window->DC.ItemFlags;
    const ImRect nav_bb_rel(nav_bb.Min - window->Pos, nav_bb.Max - window->Pos);

    // Process Init Request
    if (g.NavInitRequest && g.NavLayer == window->DC.NavLayerCurrent)
    {
        // Even if 'ImGuiItemFlags_NoNavDefaultFocus' is on (typically collapse/close button) we record the first ResultId so they can be used as a fallback
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus) || g.NavInitResultId == 0)
        {
            g.NavInitResultId = id;
            g.NavInitResultRectRel = nav_bb_rel;
        }
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus))
        {
            g.NavInitRequest = false; // Found a match, clear request
            NavUpdateAnyRequestFlag();
        }
    }

    // Process Move Request (scoring for navigation)
    // FIXME-NAV: Consider policy for double scoring (scoring from NavScoringRectScreen + scoring from a rect wrapped according to current wrapping policy)
    if ((g.NavId != id || (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AllowCurrentNavId)) && !(item_flags & (ImGuiItemFlags_Disabled|ImGuiItemFlags_NoNav)))
    {
        ImGuiNavMoveResult* result = (window == g.NavWindow) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
#if IMGUI_DEBUG_NAV_SCORING
        // [DEBUG] Score all items in NavWindow at all times
        if (!g.NavMoveRequest)
            g.NavMoveDir = g.NavMoveDirLast;
        bool new_best = NavScoreItem(result, nav_bb) && g.NavMoveRequest;
#else
        bool new_best = g.NavMoveRequest && NavScoreItem(result, nav_bb);
#endif
        if (new_best)
        {
            result->ID = id;
            result->SelectScopeId = g.MultiSelectScopeId;
            result->Window = window;
            result->RectRel = nav_bb_rel;
        }

        const float VISIBLE_RATIO = 0.70f;
        if ((g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet) && window->ClipRect.Overlaps(nav_bb))
            if (ImClamp(nav_bb.Max.y, window->ClipRect.Min.y, window->ClipRect.Max.y) - ImClamp(nav_bb.Min.y, window->ClipRect.Min.y, window->ClipRect.Max.y) >= (nav_bb.Max.y - nav_bb.Min.y) * VISIBLE_RATIO)
                if (NavScoreItem(&g.NavMoveResultLocalVisibleSet, nav_bb))
                {
                    result = &g.NavMoveResultLocalVisibleSet;
                    result->ID = id;
                    result->SelectScopeId = g.MultiSelectScopeId;
                    result->Window = window;
                    result->RectRel = nav_bb_rel;
                }
    }

    // Update window-relative bounding box of navigated item
    if (g.NavId == id)
    {
        g.NavWindow = window;                                           // Always refresh g.NavWindow, because some operations such as FocusItem() don't have a window.
        g.NavLayer = window->DC.NavLayerCurrent;
        g.NavIdIsAlive = true;
        g.NavIdTabCounter = window->DC.FocusCounterTab;
        window->NavRectRel[window->DC.NavLayerCurrent] = nav_bb_rel;    // Store item bounding box (relative to window position)
    }
}